

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage
          (ParseContext *this,MessageLite *msg,char *ptr)

{
  bool bVar1;
  ParseContext *local_40;
  int local_2c;
  ParseContext *pPStack_28;
  int old;
  char *ptr_local;
  MessageLite *msg_local;
  ParseContext *this_local;
  
  pPStack_28 = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)this;
  pPStack_28 = (ParseContext *)ReadSizeAndPushLimitAndDepth(this,ptr,&local_2c);
  if (pPStack_28 == (ParseContext *)0x0) {
    local_40 = (ParseContext *)0x0;
  }
  else {
    local_40 = (ParseContext *)(**(code **)(*(long *)ptr_local + 0x50))(ptr_local,pPStack_28,this);
  }
  pPStack_28 = local_40;
  this->depth_ = this->depth_ + 1;
  bVar1 = EpsCopyInputStream::PopLimit(&this->super_EpsCopyInputStream,local_2c);
  if (bVar1) {
    this_local = pPStack_28;
  }
  else {
    this_local = (ParseContext *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* ParseContext::ParseMessage(MessageLite* msg, const char* ptr) {
  int old;
  ptr = ReadSizeAndPushLimitAndDepth(ptr, &old);
  ptr = ptr ? msg->_InternalParse(ptr, this) : nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}